

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

int gc_printobj(lua_State *L)

{
  StkId pTVar1;
  
  luaL_checkany(L,1);
  pTVar1 = L->ci->func;
  if ((short)pTVar1[1].tt_ < 0) {
    printobj(L->l_G,pTVar1[1].value_.gc);
    putchar(10);
  }
  else {
    puts("no collectable");
  }
  return 0;
}

Assistant:

static int gc_printobj (lua_State *L) {
  TValue *o;
  luaL_checkany(L, 1);
  o = obj_at(L, 1);
  if (!iscollectable(o))
    printf("no collectable\n");
  else {
    GCObject *obj = gcvalue(o);
    printobj(G(L), obj);
    printf("\n");
  }
  return 0;
}